

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<unsigned_char>::insert(vector<unsigned_char> *this,uint index,uchar *p,uint n)

{
  uint uVar1;
  uchar *pDst;
  uint num_to_move;
  uint orig_size;
  uint n_local;
  uchar *p_local;
  uint index_local;
  vector<unsigned_char> *this_local;
  
  if (n != 0) {
    uVar1 = this->m_size;
    resize(this,this->m_size + n,true);
    memmove(this->m_p + (ulong)n + (ulong)index,this->m_p + index,(ulong)(uVar1 - index));
    memcpy(this->m_p + index,p,(ulong)n);
  }
  return;
}

Assistant:

inline void insert(uint index, const T* p, uint n)
        {
            CRNLIB_ASSERT(index <= m_size);
            if (!n)
            {
                return;
            }

            const uint orig_size = m_size;
            resize(m_size + n, true);

            const uint num_to_move = orig_size - index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This overwrites the destination object bits, but bitwise copyable means we don't need to worry about destruction.
                memmove(m_p + index + n, m_p + index, sizeof(T) * num_to_move);
            }
            else
            {
                const T* pSrc = m_p + orig_size - 1;
                T* pDst = const_cast<T*>(pSrc) + n;

                for (uint i = 0; i < num_to_move; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst-- = *pSrc--;
                }
            }

            T* pDst = m_p + index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This copies in the new bits, overwriting the existing objects, which is OK for copyable types that don't need destruction.
                memcpy(pDst, p, sizeof(T) * n);
            }
            else
            {
                for (uint i = 0; i < n; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst++ = *p++;
                }
            }
        }